

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O1

bool Covariance::Inverse<double>(double *A,int size)

{
  size_t __n;
  void *pvVar1;
  int iVar2;
  int j;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar4 = (ulong)(uint)size;
  pvVar1 = operator_new__((ulong)(uint)(size * size) << 3);
  dVar7 = recurse_determinant<double>(A,size);
  if (0.0 <= dVar7) {
    if (0 < size) {
      iVar2 = 2;
      uVar5 = 0;
      pvVar6 = pvVar1;
      do {
        uVar3 = 0;
        do {
          dVar8 = pow(-1.0,(double)(iVar2 + (int)uVar3));
          dVar9 = cofactor<double>(A,size,(int)uVar3,(int)uVar5);
          *(double *)((long)pvVar6 + uVar3 * 8) = (dVar9 / dVar7) * dVar8;
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
        uVar5 = uVar5 + 1;
        pvVar6 = (void *)((long)pvVar6 + uVar4 * 8);
        iVar2 = iVar2 + 1;
      } while (uVar5 != uVar4);
    }
    if (0 < size) {
      __n = uVar4 * 8;
      uVar5 = 0;
      do {
        memcpy(A + uVar5,(void *)((long)pvVar1 + uVar5 * 8),__n);
        uVar5 = (ulong)(uint)((int)uVar5 + size);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  operator_delete__(pvVar1);
  return 0.0 <= dVar7;
}

Assistant:

bool Inverse(T* A, int size) {
      T* B   = new T[size*size];
      T  det = recurse_determinant<T>(A, size);

      if(det < T(0.0)) {
         delete[] B;
         return false;
      }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            B[i*size + j] = pow(-1, i+j+2) * (cofactor<T>(A, size, j, i) / det);
         }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            A[i*size +j] = B[i*size + j];
         }

      delete[] B;
      return true;
   }